

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

size_type __thiscall
google::
sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *this,key_type *key)

{
  bool bVar1;
  iterator local_108;
  const_iterator local_b8;
  iterator local_68;
  
  find<int>(&local_108,this,key);
  local_b8.ht = local_108.ht;
  local_b8.pos.row_begin._M_current = local_108.pos.row_begin._M_current;
  local_b8.pos.row_end._M_current = local_108.pos.row_end._M_current;
  local_b8.pos.row_current._M_current = local_108.pos.row_current._M_current;
  local_b8.pos.col_current = local_108.pos.col_current;
  local_b8.end.row_begin._M_current = local_108.end.row_begin._M_current;
  local_b8.end.row_end._M_current = local_108.end.row_end._M_current;
  local_b8.end.row_current._M_current = local_108.end.row_current._M_current;
  local_b8.end.col_current = local_108.end.col_current;
  end(&local_68,this);
  local_108.ht = local_68.ht;
  local_108.pos.row_begin._M_current = local_68.pos.row_begin._M_current;
  local_108.pos.row_end._M_current = local_68.pos.row_end._M_current;
  local_108.pos.row_current._M_current = local_68.pos.row_current._M_current;
  local_108.pos.col_current = local_68.pos.col_current;
  local_108.end.row_begin._M_current = local_68.end.row_begin._M_current;
  local_108.end.row_end._M_current = local_68.end.row_end._M_current;
  local_108.end.row_current._M_current = local_68.end.row_current._M_current;
  local_108.end.col_current = local_68.end.col_current;
  bVar1 = const_two_d_iterator<std::vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=(&local_b8.pos,(iterator *)&local_108.pos);
  if (bVar1) {
    set_deleted(this,&local_b8);
    this->num_deleted = this->num_deleted + 1;
    (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         true;
  }
  return (ulong)bVar1;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }